

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

void __thiscall
TPZSkylMatrix<std::complex<long_double>_>::MultAdd
          (TPZSkylMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *x
          ,TPZFMatrix<std::complex<long_double>_> *y,TPZFMatrix<std::complex<long_double>_> *z,
          complex<long_double> alpha,complex<long_double> beta,int opt)

{
  complex<long_double> **ppcVar1;
  complex<long_double> *pcVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  int64_t iVar6;
  complex<long_double> *pcVar7;
  complex<long_double> *pcVar8;
  complex<long_double> *pcVar9;
  longdouble *plVar10;
  long lVar11;
  longdouble lVar12;
  longdouble lVar13;
  complex<long_double> __r_4;
  long local_120;
  complex<long_double> local_118;
  complex<long_double> local_f8;
  long local_d8;
  long local_d0;
  long local_c8;
  TPZSkylMatrix<std::complex<long_double>_> *local_c0;
  TPZFMatrix<std::complex<long_double>_> *local_b8;
  long local_b0;
  complex<long_double> local_a8;
  long local_88;
  TPZFMatrix<std::complex<long_double>_> *local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  undefined1 local_58 [40];
  
  if (opt == 0) {
    iVar6 = (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
    if (iVar6 == (x->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow)
    goto LAB_00cc7f0a;
LAB_00cc7f11:
    TPZMatrix<std::complex<long_double>_>::Error
              ("virtual void TPZSkylMatrix<std::complex<long double>>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = std::complex<long double>]"
               ," <matrixs with incompatible dimensions>");
    iVar6 = (x->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
  }
  else {
    iVar6 = (x->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
LAB_00cc7f0a:
    if ((this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow != iVar6)
    goto LAB_00cc7f11;
  }
  if ((z->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow == iVar6) {
    lVar4 = (z->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
    lVar11 = (x->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
    lVar5 = lVar4;
    if (lVar4 == lVar11) goto LAB_00cc7f56;
  }
  else {
    lVar11 = (x->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
  }
  (*(z->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xe])(z,iVar6,lVar11);
  lVar4 = (z->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
  lVar5 = (x->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
LAB_00cc7f56:
  if ((((lVar5 != (y->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol) ||
       (lVar5 != lVar4)) ||
      (lVar11 = (x->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow,
      lVar11 != (y->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow)) ||
     (lVar11 != (z->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x.Cols = ",9);
    poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," y.Cols()",9);
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," z.Cols() ",10);
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," x.Rows() ",10);
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," y.Rows() ",10);
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," z.Rows() ",10);
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    TPZMatrix<std::complex<long_double>_>::Error
              ("virtual void TPZSkylMatrix<std::complex<long double>>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = std::complex<long double>]"
               ," incompatible dimensions\n");
  }
  local_80 = z;
  TPZMatrix<std::complex<long_double>_>::PrepareZ
            (&this->super_TPZMatrix<std::complex<long_double>_>,y,z,beta,opt);
  local_88 = (x->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
  if (0 < local_88) {
    local_d0 = (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
    local_d8 = 0;
    local_120 = 0;
    local_c0 = this;
    local_b8 = x;
    do {
      if (0 < local_d0) {
        local_c8 = 0x30;
        lVar11 = 0;
        do {
          ppcVar1 = (this->fElem).fStore;
          local_60 = (long)ppcVar1[lVar11 + 1] - (long)ppcVar1[lVar11];
          local_78 = local_60 >> 5;
          local_f8._M_value._0_8_ = SUB108((longdouble)0,0);
          local_f8._M_value._8_2_ = SUB102((unkuint10)(longdouble)0 >> 0x40,0);
          local_68 = lVar11 - local_78;
          local_70 = local_68 + 1;
          pcVar8 = local_b8->fElem +
                   (local_b8->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow
                   * local_120 + local_70;
          pcVar2 = ppcVar1[lVar11];
          pcVar7 = (complex<long_double> *)((long)pcVar2 + local_60);
          local_f8._M_value._16_8_ = local_f8._M_value._0_8_;
          local_f8._M_value._24_2_ = local_f8._M_value._8_2_;
          while (pcVar9 = pcVar7 + -1, pcVar2 < pcVar9) {
            if (opt == 0) {
              local_118._M_value._0_8_ = SUB108(*(unkbyte10 *)pcVar9->_M_value,0);
              local_118._M_value._8_2_ = SUB102((unkuint10)*(unkbyte10 *)pcVar9->_M_value >> 0x40,0)
              ;
              local_118._M_value._16_8_ = SUB108(-*(longdouble *)(pcVar7[-1]._M_value + 0x10),0);
              local_118._M_value._24_2_ =
                   SUB102((unkuint10)-*(longdouble *)(pcVar7[-1]._M_value + 0x10) >> 0x40,0);
            }
            else {
              local_118._M_value._0_8_ = *(undefined8 *)pcVar9->_M_value;
              local_118._M_value._16_8_ = *(undefined8 *)(pcVar7[-1]._M_value + 0x10);
              local_118._M_value._24_2_ = SUB82(*(undefined8 *)(pcVar7[-1]._M_value + 0x18),0);
              local_118._M_value._26_6_ =
                   SUB86((ulong)*(undefined8 *)(pcVar7[-1]._M_value + 0x18) >> 0x10,0);
              local_118._M_value._8_2_ = SUB82(*(undefined8 *)(pcVar7[-1]._M_value + 8),0);
              local_118._M_value._10_6_ =
                   SUB86((ulong)*(undefined8 *)(pcVar7[-1]._M_value + 8) >> 0x10,0);
            }
            std::complex<long_double>::operator*=(&local_118,pcVar8);
            lVar13 = (longdouble)CONCAT28(local_f8._M_value._8_2_,local_f8._M_value._0_8_) +
                     (longdouble)CONCAT28(local_118._M_value._8_2_,local_118._M_value._0_8_);
            lVar12 = (longdouble)CONCAT28(local_f8._M_value._24_2_,local_f8._M_value._16_8_) +
                     (longdouble)CONCAT28(local_118._M_value._24_2_,local_118._M_value._16_8_);
            local_f8._M_value._0_8_ = SUB108(lVar13,0);
            local_f8._M_value._8_2_ = SUB102((unkuint10)lVar13 >> 0x40,0);
            local_f8._M_value._16_8_ = SUB108(lVar12,0);
            local_f8._M_value._24_2_ = SUB102((unkuint10)lVar12 >> 0x40,0);
            pcVar8 = pcVar8 + 1;
            pcVar7 = pcVar9;
          }
          if (pcVar9 == pcVar2) {
            local_118._M_value._0_8_ = *(undefined8 *)pcVar2->_M_value;
            local_118._M_value._16_8_ = *(undefined8 *)(pcVar2->_M_value + 0x10);
            local_118._M_value._24_2_ = SUB82(*(undefined8 *)(pcVar2->_M_value + 0x18),0);
            local_118._M_value._26_6_ =
                 SUB86((ulong)*(undefined8 *)(pcVar2->_M_value + 0x18) >> 0x10,0);
            local_118._M_value._8_2_ = SUB82(*(undefined8 *)(pcVar2->_M_value + 8),0);
            local_118._M_value._10_6_ =
                 SUB86((ulong)*(undefined8 *)(pcVar2->_M_value + 8) >> 0x10,0);
            std::complex<long_double>::operator*=(&local_118,pcVar8);
            lVar13 = (longdouble)CONCAT28(local_f8._M_value._8_2_,local_f8._M_value._0_8_) +
                     (longdouble)CONCAT28(local_118._M_value._8_2_,local_118._M_value._0_8_);
            lVar12 = (longdouble)CONCAT28(local_f8._M_value._24_2_,local_f8._M_value._16_8_) +
                     (longdouble)CONCAT28(local_118._M_value._24_2_,local_118._M_value._16_8_);
            local_f8._M_value._0_8_ = SUB108(lVar13,0);
            local_f8._M_value._8_2_ = SUB102((unkuint10)lVar13 >> 0x40,0);
            local_f8._M_value._16_8_ = SUB108(lVar12,0);
            local_f8._M_value._24_2_ = SUB102((unkuint10)lVar12 >> 0x40,0);
          }
          local_118._M_value._16_8_ = local_f8._M_value._16_8_;
          local_118._M_value._24_2_ = local_f8._M_value._24_2_;
          local_118._M_value._26_6_ = local_f8._M_value._26_6_;
          local_118._M_value._0_8_ = local_f8._M_value._0_8_;
          local_118._M_value._8_2_ = local_f8._M_value._8_2_;
          local_118._M_value._10_6_ = local_f8._M_value._10_6_;
          std::complex<long_double>::operator*=(&local_118,&alpha);
          lVar4 = (local_80->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
          if ((lVar4 <= lVar11) ||
             ((local_80->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol <=
              local_120)) {
            TPZFMatrix<std::complex<long_double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar4 = lVar4 * local_120;
          pcVar7 = local_80->fElem;
          lVar12 = *(longdouble *)(pcVar7[lVar4 + lVar11]._M_value + 0x10);
          *(longdouble *)pcVar7[lVar4 + lVar11]._M_value =
               *(longdouble *)pcVar7[lVar4 + lVar11]._M_value +
               (longdouble)CONCAT28(local_118._M_value._8_2_,local_118._M_value._0_8_);
          *(longdouble *)(pcVar7[lVar4 + lVar11]._M_value + 0x10) =
               lVar12 + (longdouble)CONCAT28(local_118._M_value._24_2_,local_118._M_value._16_8_);
          local_b0 = lVar11;
          if (((local_68 < -1) ||
              (lVar4 = (local_80->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
                       fRow, lVar4 <= local_70)) ||
             ((local_80->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol <=
              local_120)) {
            TPZFMatrix<std::complex<long_double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar7 = local_80->fElem;
          (*(local_b8->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable[0x24])(&local_118,local_b8,lVar11,local_120);
          local_f8._M_value._16_8_ = local_118._M_value._16_8_;
          local_f8._M_value._24_2_ = local_118._M_value._24_2_;
          local_f8._M_value._26_6_ = local_118._M_value._26_6_;
          local_f8._M_value._0_8_ = local_118._M_value._0_8_;
          local_f8._M_value._8_2_ = local_118._M_value._8_2_;
          local_f8._M_value._10_6_ = local_118._M_value._10_6_;
          pcVar8 = (complex<long_double> *)
                   ((local_c0->fElem).fStore[lVar11][-1]._M_value + local_60);
          if (pcVar2 < pcVar8) {
            plVar10 = (longdouble *)(pcVar7[-local_78]._M_value + lVar4 * local_d8 + local_c8);
            do {
              pcVar7 = pcVar8;
              if (opt != 0) {
                local_58._0_10_ = *(unkbyte10 *)pcVar8->_M_value;
                local_58._16_10_ = -*(longdouble *)(pcVar8->_M_value + 0x10);
                pcVar7 = (complex<long_double> *)local_58;
              }
              local_a8._M_value._24_8_ = alpha._M_value._24_8_;
              local_a8._M_value._16_8_ = alpha._M_value._16_8_;
              local_a8._M_value._8_8_ = alpha._M_value._8_8_;
              local_a8._M_value._0_8_ = alpha._M_value._0_8_;
              std::complex<long_double>::operator*=(&local_a8,pcVar7);
              local_118._M_value._0_8_ = local_a8._M_value._0_8_;
              local_118._M_value._8_2_ = local_a8._M_value._8_2_;
              local_118._M_value._10_6_ = local_a8._M_value._10_6_;
              local_118._M_value._16_8_ = local_a8._M_value._16_8_;
              local_118._M_value._24_2_ = local_a8._M_value._24_2_;
              local_118._M_value._26_6_ = local_a8._M_value._26_6_;
              std::complex<long_double>::operator*=(&local_118,&local_f8);
              plVar10[-1] = plVar10[-1] +
                            (longdouble)CONCAT28(local_118._M_value._8_2_,local_118._M_value._0_8_);
              *plVar10 = *plVar10 +
                         (longdouble)CONCAT28(local_118._M_value._24_2_,local_118._M_value._16_8_);
              pcVar8 = pcVar8 + -1;
              plVar10 = plVar10 + 2;
            } while (pcVar2 < pcVar8);
          }
          lVar11 = local_b0 + 1;
          local_c8 = local_c8 + 0x20;
          this = local_c0;
        } while (lVar11 != local_d0);
      }
      local_120 = local_120 + 1;
      local_d8 = local_d8 + 0x20;
    } while (local_120 != local_88);
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                                  const TVar alpha,const TVar beta ,const int opt) const {
	// Computes z = beta * y + alpha * opt(this)*x
	//          z and x cannot overlap in memory
	
	if (this->fDecomposed != ENoDecompose) {
        //		DebugStop();
	}
	if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__," <matrixs with incompatible dimensions>" );
	if(z.Rows() != x.Rows() || z.Cols() != x.Cols()) z.Redim(x.Rows(),x.Cols());
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows() || x.Rows() != z.Rows()) {
		cout << "x.Cols = " << x.Cols() << " y.Cols()"<< y.Cols() << " z.Cols() " << z.Cols() << " x.Rows() " << x.Rows() << " y.Rows() "<< y.Rows() << " z.Rows() "<< z.Rows() << endl;
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__," incompatible dimensions\n");
	}
	this->PrepareZ(y,z,beta,opt);

	const int64_t rows = this->Rows();
	const int64_t xcols = x.Cols();
	for (auto ic = 0; ic < xcols; ic++) {
		for(auto r = 0 ; r < rows ; r++ ) {
			const int64_t offset = Size(r);
			TVar val = 0.;
			const TVar *p = &x.g((r-offset+1),ic);
			TVar *diag = fElem[r] + offset-1;
			const TVar *diaglast = fElem[r];
			while( diag > diaglast ) {
                if constexpr (is_complex<TVar>::value){
                    if(opt) val += *diag-- * *p;
                    else val += std::conj(*diag--) * *p;
                }else{
                    val += *diag-- * *p;
                }
				p ++;
			}
			if( diag == diaglast ) val += *diag * *p;
			z(r,ic) += val*alpha;
			TVar *zp = &z((r-offset+1),ic);
			val = x.GetVal(r,ic);
			diag = fElem[r] + offset-1;
			while( diag > diaglast ) {
                if constexpr (is_complex<TVar>::value){
                    if(opt) *zp += alpha * std::conj(*diag--) * val;
                    else *zp += alpha * *diag-- * val;
                }else{
                    *zp += alpha * *diag-- * val;
                }
                zp ++;
			}
		}
	}
}